

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void mbedtls_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint local_14c;
  uint local_148;
  uint i;
  uint32_t A [8];
  uint32_t W [64];
  uint32_t temp2;
  uint32_t temp1;
  uchar *data_local;
  mbedtls_sha256_context *ctx_local;
  
  for (local_14c = 0; local_14c < 8; local_14c = local_14c + 1) {
    (&local_148)[local_14c] = ctx->state[local_14c];
  }
  for (local_14c = 0; local_14c < 0x10; local_14c = local_14c + 1) {
    A[(ulong)local_14c + 6] =
         (uint)data[local_14c << 2] << 0x18 | (uint)data[local_14c * 4 + 1] << 0x10 |
         (uint)data[local_14c * 4 + 2] << 8 | (uint)data[local_14c * 4 + 3];
  }
  for (local_14c = 0; local_14c < 0x10; local_14c = local_14c + 8) {
    iVar2 = A[5] + ((A[2] >> 6 | A[2] << 0x1a) ^ (A[2] >> 0xb | A[2] << 0x15) ^
                   (A[2] >> 0x19 | A[2] << 7)) + (A[4] ^ A[2] & (A[3] ^ A[4])) + K[local_14c] +
            A[(ulong)local_14c + 6];
    A[1] = iVar2 + A[1];
    A[5] = iVar2 + ((local_148 >> 2 | local_148 << 0x1e) ^ (local_148 >> 0xd | local_148 << 0x13) ^
                   (local_148 >> 0x16 | local_148 << 10)) + (local_148 & i | A[0] & (local_148 | i))
    ;
    iVar2 = A[4] + ((A[1] >> 6 | A[1] * 0x4000000) ^ (A[1] >> 0xb | A[1] * 0x200000) ^
                   (A[1] >> 0x19 | A[1] * 0x80)) + (A[3] ^ A[1] & (A[2] ^ A[3])) + K[local_14c + 1]
            + A[(ulong)(local_14c + 1) + 6];
    A[0] = iVar2 + A[0];
    A[4] = iVar2 + ((A[5] >> 2 | A[5] * 0x40000000) ^ (A[5] >> 0xd | A[5] * 0x80000) ^
                   (A[5] >> 0x16 | A[5] * 0x400)) + (A[5] & local_148 | i & (A[5] | local_148));
    iVar2 = A[3] + ((A[0] >> 6 | A[0] * 0x4000000) ^ (A[0] >> 0xb | A[0] * 0x200000) ^
                   (A[0] >> 0x19 | A[0] * 0x80)) + (A[2] ^ A[0] & (A[1] ^ A[2])) + K[local_14c + 2]
            + A[(ulong)(local_14c + 2) + 6];
    i = iVar2 + i;
    A[3] = iVar2 + ((A[4] >> 2 | A[4] * 0x40000000) ^ (A[4] >> 0xd | A[4] * 0x80000) ^
                   (A[4] >> 0x16 | A[4] * 0x400)) + (A[4] & A[5] | local_148 & (A[4] | A[5]));
    iVar2 = A[2] + ((i >> 6 | i * 0x4000000) ^ (i >> 0xb | i * 0x200000) ^ (i >> 0x19 | i * 0x80)) +
            (A[1] ^ i & (A[0] ^ A[1])) + K[local_14c + 3] + A[(ulong)(local_14c + 3) + 6];
    local_148 = iVar2 + local_148;
    A[2] = iVar2 + ((A[3] >> 2 | A[3] * 0x40000000) ^ (A[3] >> 0xd | A[3] * 0x80000) ^
                   (A[3] >> 0x16 | A[3] * 0x400)) + (A[3] & A[4] | A[5] & (A[3] | A[4]));
    iVar2 = A[1] + ((local_148 >> 6 | local_148 * 0x4000000) ^
                    (local_148 >> 0xb | local_148 * 0x200000) ^
                   (local_148 >> 0x19 | local_148 * 0x80)) + (A[0] ^ local_148 & (i ^ A[0])) +
            K[local_14c + 4] + A[(ulong)(local_14c + 4) + 6];
    A[5] = iVar2 + A[5];
    A[1] = iVar2 + ((A[2] >> 2 | A[2] * 0x40000000) ^ (A[2] >> 0xd | A[2] * 0x80000) ^
                   (A[2] >> 0x16 | A[2] * 0x400)) + (A[2] & A[3] | A[4] & (A[2] | A[3]));
    iVar2 = A[0] + ((A[5] >> 6 | A[5] * 0x4000000) ^ (A[5] >> 0xb | A[5] * 0x200000) ^
                   (A[5] >> 0x19 | A[5] * 0x80)) + (i ^ A[5] & (local_148 ^ i)) + K[local_14c + 5] +
            A[(ulong)(local_14c + 5) + 6];
    A[4] = iVar2 + A[4];
    A[0] = iVar2 + ((A[1] >> 2 | A[1] * 0x40000000) ^ (A[1] >> 0xd | A[1] * 0x80000) ^
                   (A[1] >> 0x16 | A[1] * 0x400)) + (A[1] & A[2] | A[3] & (A[1] | A[2]));
    iVar2 = i + ((A[4] >> 6 | A[4] * 0x4000000) ^ (A[4] >> 0xb | A[4] * 0x200000) ^
                (A[4] >> 0x19 | A[4] * 0x80)) + (local_148 ^ A[4] & (A[5] ^ local_148)) +
            K[local_14c + 6] + A[(ulong)(local_14c + 6) + 6];
    A[3] = iVar2 + A[3];
    i = iVar2 + ((A[0] >> 2 | A[0] * 0x40000000) ^ (A[0] >> 0xd | A[0] * 0x80000) ^
                (A[0] >> 0x16 | A[0] * 0x400)) + (A[0] & A[1] | A[2] & (A[0] | A[1]));
    iVar2 = local_148 +
            ((A[3] >> 6 | A[3] * 0x4000000) ^ (A[3] >> 0xb | A[3] * 0x200000) ^
            (A[3] >> 0x19 | A[3] * 0x80)) + (A[5] ^ A[3] & (A[4] ^ A[5])) + K[local_14c + 7] +
            A[(ulong)(local_14c + 7) + 6];
    A[2] = iVar2 + A[2];
    local_148 = iVar2 + ((i >> 2 | i * 0x40000000) ^ (i >> 0xd | i * 0x80000) ^
                        (i >> 0x16 | i * 0x400)) + (i & A[0] | A[1] & (i | A[0]));
  }
  for (local_14c = 0x10; local_14c < 0x40; local_14c = local_14c + 8) {
    uVar1 = K[local_14c];
    uVar3 = ((A[(ulong)(local_14c - 2) + 6] >> 0x11 | A[(ulong)(local_14c - 2) + 6] << 0xf) ^
             (A[(ulong)(local_14c - 2) + 6] >> 0x13 | A[(ulong)(local_14c - 2) + 6] << 0xd) ^
            A[(ulong)(local_14c - 2) + 6] >> 10) + A[(ulong)(local_14c - 7) + 6] +
            ((A[(ulong)(local_14c - 0xf) + 6] >> 7 | A[(ulong)(local_14c - 0xf) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 0xf) + 6] >> 0x12 | A[(ulong)(local_14c - 0xf) + 6] << 0xe) ^
            A[(ulong)(local_14c - 0xf) + 6] >> 3) + A[(ulong)(local_14c - 0x10) + 6];
    A[(ulong)local_14c + 6] = uVar3;
    iVar2 = A[5] + ((A[2] >> 6 | A[2] << 0x1a) ^ (A[2] >> 0xb | A[2] << 0x15) ^
                   (A[2] >> 0x19 | A[2] << 7)) + (A[4] ^ A[2] & (A[3] ^ A[4])) + uVar1 + uVar3;
    A[1] = iVar2 + A[1];
    A[5] = iVar2 + ((local_148 >> 2 | local_148 << 0x1e) ^ (local_148 >> 0xd | local_148 << 0x13) ^
                   (local_148 >> 0x16 | local_148 << 10)) + (local_148 & i | A[0] & (local_148 | i))
    ;
    uVar1 = K[local_14c + 1];
    uVar3 = ((A[(ulong)(local_14c - 1) + 6] >> 0x11 | A[(ulong)(local_14c - 1) + 6] << 0xf) ^
             (A[(ulong)(local_14c - 1) + 6] >> 0x13 | A[(ulong)(local_14c - 1) + 6] << 0xd) ^
            A[(ulong)(local_14c - 1) + 6] >> 10) + A[(ulong)(local_14c - 6) + 6] +
            ((A[(ulong)(local_14c - 0xe) + 6] >> 7 | A[(ulong)(local_14c - 0xe) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 0xe) + 6] >> 0x12 | A[(ulong)(local_14c - 0xe) + 6] << 0xe) ^
            A[(ulong)(local_14c - 0xe) + 6] >> 3) + A[(ulong)(local_14c - 0xf) + 6];
    A[(ulong)(local_14c + 1) + 6] = uVar3;
    iVar2 = A[4] + ((A[1] >> 6 | A[1] * 0x4000000) ^ (A[1] >> 0xb | A[1] * 0x200000) ^
                   (A[1] >> 0x19 | A[1] * 0x80)) + (A[3] ^ A[1] & (A[2] ^ A[3])) + uVar1 + uVar3;
    A[0] = iVar2 + A[0];
    A[4] = iVar2 + ((A[5] >> 2 | A[5] * 0x40000000) ^ (A[5] >> 0xd | A[5] * 0x80000) ^
                   (A[5] >> 0x16 | A[5] * 0x400)) + (A[5] & local_148 | i & (A[5] | local_148));
    uVar1 = K[local_14c + 2];
    uVar3 = ((A[(ulong)local_14c + 6] >> 0x11 | A[(ulong)local_14c + 6] << 0xf) ^
             (A[(ulong)local_14c + 6] >> 0x13 | A[(ulong)local_14c + 6] << 0xd) ^
            A[(ulong)local_14c + 6] >> 10) + A[(ulong)(local_14c - 5) + 6] +
            ((A[(ulong)(local_14c - 0xd) + 6] >> 7 | A[(ulong)(local_14c - 0xd) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 0xd) + 6] >> 0x12 | A[(ulong)(local_14c - 0xd) + 6] << 0xe) ^
            A[(ulong)(local_14c - 0xd) + 6] >> 3) + A[(ulong)(local_14c - 0xe) + 6];
    A[(ulong)(local_14c + 2) + 6] = uVar3;
    iVar2 = A[3] + ((A[0] >> 6 | A[0] * 0x4000000) ^ (A[0] >> 0xb | A[0] * 0x200000) ^
                   (A[0] >> 0x19 | A[0] * 0x80)) + (A[2] ^ A[0] & (A[1] ^ A[2])) + uVar1 + uVar3;
    i = iVar2 + i;
    A[3] = iVar2 + ((A[4] >> 2 | A[4] * 0x40000000) ^ (A[4] >> 0xd | A[4] * 0x80000) ^
                   (A[4] >> 0x16 | A[4] * 0x400)) + (A[4] & A[5] | local_148 & (A[4] | A[5]));
    uVar1 = K[local_14c + 3];
    uVar3 = ((A[(ulong)(local_14c + 1) + 6] >> 0x11 | A[(ulong)(local_14c + 1) + 6] << 0xf) ^
             (A[(ulong)(local_14c + 1) + 6] >> 0x13 | A[(ulong)(local_14c + 1) + 6] << 0xd) ^
            A[(ulong)(local_14c + 1) + 6] >> 10) + A[(ulong)(local_14c - 4) + 6] +
            ((A[(ulong)(local_14c - 0xc) + 6] >> 7 | A[(ulong)(local_14c - 0xc) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 0xc) + 6] >> 0x12 | A[(ulong)(local_14c - 0xc) + 6] << 0xe) ^
            A[(ulong)(local_14c - 0xc) + 6] >> 3) + A[(ulong)(local_14c - 0xd) + 6];
    A[(ulong)(local_14c + 3) + 6] = uVar3;
    iVar2 = A[2] + ((i >> 6 | i * 0x4000000) ^ (i >> 0xb | i * 0x200000) ^ (i >> 0x19 | i * 0x80)) +
            (A[1] ^ i & (A[0] ^ A[1])) + uVar1 + uVar3;
    local_148 = iVar2 + local_148;
    A[2] = iVar2 + ((A[3] >> 2 | A[3] * 0x40000000) ^ (A[3] >> 0xd | A[3] * 0x80000) ^
                   (A[3] >> 0x16 | A[3] * 0x400)) + (A[3] & A[4] | A[5] & (A[3] | A[4]));
    uVar1 = K[local_14c + 4];
    uVar3 = ((A[(ulong)(local_14c + 2) + 6] >> 0x11 | A[(ulong)(local_14c + 2) + 6] << 0xf) ^
             (A[(ulong)(local_14c + 2) + 6] >> 0x13 | A[(ulong)(local_14c + 2) + 6] << 0xd) ^
            A[(ulong)(local_14c + 2) + 6] >> 10) + A[(ulong)(local_14c - 3) + 6] +
            ((A[(ulong)(local_14c - 0xb) + 6] >> 7 | A[(ulong)(local_14c - 0xb) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 0xb) + 6] >> 0x12 | A[(ulong)(local_14c - 0xb) + 6] << 0xe) ^
            A[(ulong)(local_14c - 0xb) + 6] >> 3) + A[(ulong)(local_14c - 0xc) + 6];
    A[(ulong)(local_14c + 4) + 6] = uVar3;
    iVar2 = A[1] + ((local_148 >> 6 | local_148 * 0x4000000) ^
                    (local_148 >> 0xb | local_148 * 0x200000) ^
                   (local_148 >> 0x19 | local_148 * 0x80)) + (A[0] ^ local_148 & (i ^ A[0])) + uVar1
            + uVar3;
    A[5] = iVar2 + A[5];
    A[1] = iVar2 + ((A[2] >> 2 | A[2] * 0x40000000) ^ (A[2] >> 0xd | A[2] * 0x80000) ^
                   (A[2] >> 0x16 | A[2] * 0x400)) + (A[2] & A[3] | A[4] & (A[2] | A[3]));
    uVar1 = K[local_14c + 5];
    uVar3 = ((A[(ulong)(local_14c + 3) + 6] >> 0x11 | A[(ulong)(local_14c + 3) + 6] << 0xf) ^
             (A[(ulong)(local_14c + 3) + 6] >> 0x13 | A[(ulong)(local_14c + 3) + 6] << 0xd) ^
            A[(ulong)(local_14c + 3) + 6] >> 10) + A[(ulong)(local_14c - 2) + 6] +
            ((A[(ulong)(local_14c - 10) + 6] >> 7 | A[(ulong)(local_14c - 10) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 10) + 6] >> 0x12 | A[(ulong)(local_14c - 10) + 6] << 0xe) ^
            A[(ulong)(local_14c - 10) + 6] >> 3) + A[(ulong)(local_14c - 0xb) + 6];
    A[(ulong)(local_14c + 5) + 6] = uVar3;
    iVar2 = A[0] + ((A[5] >> 6 | A[5] * 0x4000000) ^ (A[5] >> 0xb | A[5] * 0x200000) ^
                   (A[5] >> 0x19 | A[5] * 0x80)) + (i ^ A[5] & (local_148 ^ i)) + uVar1 + uVar3;
    A[4] = iVar2 + A[4];
    A[0] = iVar2 + ((A[1] >> 2 | A[1] * 0x40000000) ^ (A[1] >> 0xd | A[1] * 0x80000) ^
                   (A[1] >> 0x16 | A[1] * 0x400)) + (A[1] & A[2] | A[3] & (A[1] | A[2]));
    uVar1 = K[local_14c + 6];
    uVar3 = ((A[(ulong)(local_14c + 4) + 6] >> 0x11 | A[(ulong)(local_14c + 4) + 6] << 0xf) ^
             (A[(ulong)(local_14c + 4) + 6] >> 0x13 | A[(ulong)(local_14c + 4) + 6] << 0xd) ^
            A[(ulong)(local_14c + 4) + 6] >> 10) + A[(ulong)(local_14c - 1) + 6] +
            ((A[(ulong)(local_14c - 9) + 6] >> 7 | A[(ulong)(local_14c - 9) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 9) + 6] >> 0x12 | A[(ulong)(local_14c - 9) + 6] << 0xe) ^
            A[(ulong)(local_14c - 9) + 6] >> 3) + A[(ulong)(local_14c - 10) + 6];
    A[(ulong)(local_14c + 6) + 6] = uVar3;
    iVar2 = i + ((A[4] >> 6 | A[4] * 0x4000000) ^ (A[4] >> 0xb | A[4] * 0x200000) ^
                (A[4] >> 0x19 | A[4] * 0x80)) + (local_148 ^ A[4] & (A[5] ^ local_148)) + uVar1 +
            uVar3;
    A[3] = iVar2 + A[3];
    i = iVar2 + ((A[0] >> 2 | A[0] * 0x40000000) ^ (A[0] >> 0xd | A[0] * 0x80000) ^
                (A[0] >> 0x16 | A[0] * 0x400)) + (A[0] & A[1] | A[2] & (A[0] | A[1]));
    uVar1 = K[local_14c + 7];
    uVar3 = ((A[(ulong)(local_14c + 5) + 6] >> 0x11 | A[(ulong)(local_14c + 5) + 6] << 0xf) ^
             (A[(ulong)(local_14c + 5) + 6] >> 0x13 | A[(ulong)(local_14c + 5) + 6] << 0xd) ^
            A[(ulong)(local_14c + 5) + 6] >> 10) + A[(ulong)local_14c + 6] +
            ((A[(ulong)(local_14c - 8) + 6] >> 7 | A[(ulong)(local_14c - 8) + 6] << 0x19) ^
             (A[(ulong)(local_14c - 8) + 6] >> 0x12 | A[(ulong)(local_14c - 8) + 6] << 0xe) ^
            A[(ulong)(local_14c - 8) + 6] >> 3) + A[(ulong)(local_14c - 9) + 6];
    A[(ulong)(local_14c + 7) + 6] = uVar3;
    iVar2 = local_148 +
            ((A[3] >> 6 | A[3] * 0x4000000) ^ (A[3] >> 0xb | A[3] * 0x200000) ^
            (A[3] >> 0x19 | A[3] * 0x80)) + (A[5] ^ A[3] & (A[4] ^ A[5])) + uVar1 + uVar3;
    A[2] = iVar2 + A[2];
    local_148 = iVar2 + ((i >> 2 | i * 0x40000000) ^ (i >> 0xd | i * 0x80000) ^
                        (i >> 0x16 | i * 0x400)) + (i & A[0] | A[1] & (i | A[0]));
  }
  for (local_14c = 0; local_14c < 8; local_14c = local_14c + 1) {
    ctx->state[local_14c] = (&local_148)[local_14c] + ctx->state[local_14c];
  }
  return;
}

Assistant:

void mbedtls_sha256_process( mbedtls_sha256_context *ctx, const unsigned char data[64] )
{
    uint32_t temp1, temp2, W[64];
    uint32_t A[8];
    unsigned int i;

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA256_SMALLER)
    for( i = 0; i < 64; i++ )
    {
        if( i < 16 )
            GET_UINT32_BE( W[i], data, 4 * i );
        else
            R( i );

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for( i = 0; i < 16; i++ )
        GET_UINT32_BE( W[i], data, 4 * i );

    for( i = 0; i < 16; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i+0], K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i+1], K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i+2], K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i+3], K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i+4], K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i+5], K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i+6], K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i+7], K[i+7] );
    }

    for( i = 16; i < 64; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], R(i+0), K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], R(i+1), K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], R(i+2), K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], R(i+3), K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], R(i+4), K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], R(i+5), K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], R(i+6), K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], R(i+7), K[i+7] );
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];
}